

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_tracer.h
# Opt level: O0

stepping_variable __thiscall
AbstractIsolineTracer<double>::determine_integration_type(AbstractIsolineTracer<double> *this)

{
  double dVar1;
  reference pdVar2;
  CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *this_00;
  allocator local_71;
  string local_70;
  double *local_50;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_48;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  double *local_38;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_30;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  stepping_variable local_1c;
  AbstractIsolineTracer<double> *pAStack_18;
  stepping_variable mode;
  AbstractIsolineTracer<double> *this_local;
  
  if (this->mode == STEP_INVALID) {
    pAStack_18 = this;
    if (this->imposed_variable == IMPOSED_T) {
      this->m_T = this->imposed_value;
      dVar1 = this->m_T;
      local_30._M_current =
           (double *)std::vector<double,_std::allocator<double>_>::cbegin(&this->Tc);
      local_38 = (double *)std::vector<double,_std::allocator<double>_>::cend(&this->Tc);
      local_28 = std::
                 min_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                           (local_30,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                      )local_38);
      pdVar2 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*(&local_28);
      if (*pdVar2 <= dVar1) {
        local_1c = STEP_IN_P;
      }
      else {
        local_1c = STEP_IN_RHO0;
      }
    }
    else {
      if (this->imposed_variable != IMPOSED_P) {
        this_00 = (CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *)
                  __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_70,"Invalid imposed variable",&local_71);
        CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::CoolPropError
                  (this_00,&local_70,eValue);
        __cxa_throw(this_00,&CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::
                             typeinfo,
                    CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::~CoolPropError
                   );
      }
      dVar1 = this->imposed_value;
      local_48._M_current =
           (double *)std::vector<double,_std::allocator<double>_>::cbegin(&this->pc);
      local_50 = (double *)std::vector<double,_std::allocator<double>_>::cend(&this->pc);
      local_40 = std::
                 max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                           (local_48,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                      )local_50);
      pdVar2 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*(&local_40);
      if (*pdVar2 <= dVar1) {
        local_1c = STEP_IN_T;
      }
      else {
        local_1c = STEP_IN_RHO0;
      }
    }
    this_local._4_4_ = local_1c;
  }
  else {
    this_local._4_4_ = this->mode;
  }
  return this_local._4_4_;
}

Assistant:

virtual stepping_variable determine_integration_type() {

        // If already specified, override the default logic
        if (this->mode != STEP_INVALID) {
            return this->mode;
        }

        stepping_variable mode;
        if (imposed_variable == IMPOSED_T) {
            m_T = imposed_value;
            if (m_T < *std::min_element(Tc.cbegin(), Tc.cend())) {
                // This is a subcritical isotherm, T is less than both critical temperatures
                mode = AbstractIsolineTracer::STEP_IN_RHO0;
            }
            else {
                mode = AbstractIsolineTracer::STEP_IN_P;
            }
        }
        else if (imposed_variable == IMPOSED_P) {
            if (imposed_value < *std::max_element(pc.cbegin(), pc.cend())) {
                // This is a subcritical isobar, p is less than both critical pressures. Therefore
                // we will step in the concentration of one of the components of the binary. 
                mode = AbstractIsolineTracer::STEP_IN_RHO0;
            }
            else {
                mode = AbstractIsolineTracer::STEP_IN_T;
            }
        }
        else {
            throw ValueError("Invalid imposed variable");
        }
        return mode;
    }